

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O1

uint32_t helper_usubaddx_aarch64(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = (b >> 0x10) + (a & 0xffff);
  uVar3 = (a >> 0x10) - (b & 0xffff);
  iVar2 = (uint)(0xffff < uVar1) * 3 + 0xc;
  if (0xffff < uVar3) {
    iVar2 = (uint)(0xffff < uVar1) * 3;
  }
  *(int *)gep = iVar2;
  return uVar1 & 0xffff | uVar3 * 0x10000;
}

Assistant:

uint32_t HELPER(glue(PFX,subaddx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b >> 16, 0);
    SUB16(a >> 16, b, 1);
    SET_GE;
    return res;
}